

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPMINRES.cpp
# Opt level: O3

double __thiscall
chrono::ChSolverPMINRES::Solve_SupportingStiffness(ChSolverPMINRES *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  double *pdVar2;
  undefined1 (*pauVar3) [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Index IVar21;
  double *pdVar22;
  int iVar23;
  int iVar24;
  Index index_1;
  ChLog *pCVar25;
  ChStreamOutAscii *pCVar26;
  Index index_3;
  ulong uVar27;
  char *pcVar28;
  Index index;
  ulong uVar29;
  uint iternum;
  SrcEvaluatorType srcEvaluator;
  SrcEvaluatorType srcEvaluator_1;
  double *pdVar30;
  Index dstRows;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar41 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 in_ZMM3 [64];
  ChVectorDynamic<> mz;
  ChVectorDynamic<> mr;
  ChVectorDynamic<> mp;
  ChVectorDynamic<> mtmp;
  ChVectorDynamic<> mZMr;
  ChVectorDynamic<> mMZp;
  ChVectorDynamic<> mZp;
  ChVectorDynamic<> mx;
  ChVectorDynamic<> mDi;
  ChVectorDynamic<> mZMr_old;
  ChVectorDynamic<> mz_old;
  ChVectorDynamic<> md;
  scalar_max_op<double,_double,_0> local_189;
  DenseStorage<double,__1,__1,_1,_0> local_188;
  double local_178;
  undefined8 uStack_170;
  DenseStorage<double,__1,__1,_1,_0> local_168;
  DenseStorage<double,__1,__1,_1,_0> local_158;
  DenseStorage<double,__1,__1,_1,_0> local_148;
  DenseStorage<double,__1,__1,_1,_0> local_138;
  DenseStorage<double,__1,__1,_1,_0> local_128;
  DenseStorage<double,__1,__1,_1,_0> local_118;
  DenseStorage<double,__1,__1,_1,_0> local_108;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_f0;
  double local_d8;
  undefined8 uStack_d0;
  DenseStorage<double,__1,__1,_1,_0> local_c8;
  DenseStorage<double,__1,__1,_1,_0> local_b8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a0;
  undefined1 local_88 [16];
  DenseStorage<double,__1,__1,_1,_0> local_78;
  DenseStorage<double,__1,__1,_1,_0> local_68;
  Scalar local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar41 = in_ZMM3._0_16_;
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  iVar23 = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  iVar24 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
    pCVar25 = GetLog();
    pCVar26 = ChStreamOutAscii::operator<<
                        (&pCVar25->super_ChStreamOutAscii,
                         "\n-----Projected MINRES -supporting stiffness-, n.vars nx=");
    pCVar26 = ChStreamOutAscii::operator<<(pCVar26,iVar24 + iVar23);
    pCVar26 = ChStreamOutAscii::operator<<(pCVar26,"  max.iters=");
    pCVar26 = ChStreamOutAscii::operator<<
                        (pCVar26,(this->super_ChIterativeSolverVI).super_ChIterativeSolver.
                                 m_max_iterations);
    ChStreamOutAscii::operator<<(pCVar26,"\n");
  }
  lVar31 = (long)(iVar24 + iVar23);
  local_108.m_data = (double *)0x0;
  local_108.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108,lVar31);
  local_68.m_data = (double *)0x0;
  local_68.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_68,lVar31);
  local_158.m_data = (double *)0x0;
  local_158.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,lVar31);
  local_168.m_data = (double *)0x0;
  local_168.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_168,lVar31);
  local_188.m_data = (double *)0x0;
  local_188.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_188,lVar31);
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_78,lVar31);
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_118,lVar31);
  local_128.m_data = (double *)0x0;
  local_128.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128,lVar31);
  local_138.m_data = (double *)0x0;
  local_138.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_138,lVar31);
  local_b8.m_data = (double *)0x0;
  local_b8.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_b8,lVar31);
  local_148.m_data = (double *)0x0;
  local_148.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,lVar31);
  local_c8.m_data = (double *)0x0;
  local_c8.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_c8,lVar31);
  (*sysd->_vptr_ChSystemDescriptor[0xf])(sysd);
  if (0 < local_c8.m_rows) {
    auVar34 = vbroadcastsd_avx512f(ZEXT816(0x3e112e0be826d695));
    auVar41 = auVar34._0_16_;
    auVar35 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar37 = vbroadcastsd_avx512f(ZEXT816(0x7fffffffffffffff));
    auVar38 = vpbroadcastq_avx512f();
    uVar29 = 0;
    do {
      auVar39 = vpbroadcastq_avx512f();
      auVar39 = vporq_avx512f(auVar39,auVar36);
      uVar16 = vpcmpuq_avx512f(auVar39,auVar38,2);
      pdVar2 = local_c8.m_data + uVar29;
      auVar39._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * (long)pdVar2[1];
      auVar39._0_8_ = (ulong)((byte)uVar16 & 1) * (long)*pdVar2;
      auVar39._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * (long)pdVar2[2];
      auVar39._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * (long)pdVar2[3];
      auVar39._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * (long)pdVar2[4];
      auVar39._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * (long)pdVar2[5];
      auVar39._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * (long)pdVar2[6];
      auVar39._56_8_ = (uVar16 >> 7) * (long)pdVar2[7];
      auVar40 = vandpd_avx512dq(auVar39,auVar37);
      uVar27 = vcmppd_avx512f(auVar40,auVar34,0xe);
      auVar39 = vdivpd_avx512f(auVar35,auVar39);
      bVar8 = (bool)((byte)uVar27 & 1);
      bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar27 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar27 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar27 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar27 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar27 >> 6) & 1);
      pauVar3 = (undefined1 (*) [64])(local_c8.m_data + uVar29);
      bVar9 = (bool)((byte)uVar16 & 1);
      auVar40._0_8_ =
           (ulong)bVar9 * ((ulong)bVar8 * auVar39._0_8_ | (ulong)!bVar8 * auVar35._0_8_) |
           (ulong)!bVar9 * *(long *)*pauVar3;
      bVar8 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar40._8_8_ =
           (ulong)bVar8 * ((ulong)bVar10 * auVar39._8_8_ | (ulong)!bVar10 * auVar35._8_8_) |
           (ulong)!bVar8 * *(long *)(*pauVar3 + 8);
      bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar40._16_8_ =
           (ulong)bVar8 * ((ulong)bVar11 * auVar39._16_8_ | (ulong)!bVar11 * auVar35._16_8_) |
           (ulong)!bVar8 * *(long *)(*pauVar3 + 0x10);
      bVar8 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar40._24_8_ =
           (ulong)bVar8 * ((ulong)bVar12 * auVar39._24_8_ | (ulong)!bVar12 * auVar35._24_8_) |
           (ulong)!bVar8 * *(long *)(*pauVar3 + 0x18);
      bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
      auVar40._32_8_ =
           (ulong)bVar8 * ((ulong)bVar13 * auVar39._32_8_ | (ulong)!bVar13 * auVar35._32_8_) |
           (ulong)!bVar8 * *(long *)(*pauVar3 + 0x20);
      bVar8 = (bool)((byte)(uVar16 >> 5) & 1);
      auVar40._40_8_ =
           (ulong)bVar8 * ((ulong)bVar14 * auVar39._40_8_ | (ulong)!bVar14 * auVar35._40_8_) |
           (ulong)!bVar8 * *(long *)(*pauVar3 + 0x28);
      bVar8 = (bool)((byte)(uVar16 >> 6) & 1);
      auVar40._48_8_ =
           (ulong)bVar8 * ((ulong)bVar15 * auVar39._48_8_ | (ulong)!bVar15 * auVar35._48_8_) |
           (ulong)!bVar8 * *(long *)(*pauVar3 + 0x30);
      auVar40._56_8_ =
           (uVar16 >> 7) *
           ((uVar27 >> 7) * auVar39._56_8_ | (ulong)!SUB81(uVar27 >> 7,0) * auVar35._56_8_) |
           (ulong)!SUB81(uVar16 >> 7,0) * *(long *)(*pauVar3 + 0x38);
      *pauVar3 = auVar40;
      uVar29 = uVar29 + 8;
    } while ((local_c8.m_rows + 7U & 0xfffffffffffffff8) != uVar29);
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    if (local_108.m_rows < 0) {
      pcVar28 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
LAB_007bb9e0:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar28);
    }
    if (local_108.m_rows != 0) {
      memset(local_108.m_data,0,local_108.m_rows << 3);
    }
  }
  else {
    (*sysd->_vptr_ChSystemDescriptor[0x14])(sysd,&local_108,1);
  }
  (*sysd->_vptr_ChSystemDescriptor[0xe])(sysd,&local_68);
  local_178 = (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance;
  local_d8 = this->rel_tolerance;
  if (local_68.m_rows == 0) {
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_88._8_8_;
    local_88 = auVar33 << 0x40;
  }
  else {
    local_f0.m_lhs = (LhsNested)&local_68;
    if (local_68.m_rows < 1) {
      pcVar28 = 
      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
      ;
      goto LAB_007bbaa8;
    }
    local_a0.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_68.m_data;
    local_88._0_8_ =
         Eigen::internal::
         redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
         ::
         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&local_a0,&local_189,
                    (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&local_f0);
  }
  (*sysd->_vptr_ChSystemDescriptor[0x19])(sysd,&local_108);
  (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_168,&local_108);
  IVar21 = local_168.m_rows;
  if (local_68.m_rows != local_168.m_rows) {
LAB_007bba07:
    pcVar28 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
LAB_007bba64:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar28);
  }
  pdVar2 = local_168.m_data;
  uVar29 = local_68.m_rows + 7;
  if (-1 < local_68.m_rows) {
    uVar29 = local_68.m_rows;
  }
  uVar29 = uVar29 & 0xfffffffffffffff8;
  if (7 < local_68.m_rows) {
    lVar31 = 0;
    do {
      auVar34 = vsubpd_avx512f(*(undefined1 (*) [64])(local_68.m_data + lVar31),
                               *(undefined1 (*) [64])(local_168.m_data + lVar31));
      *(undefined1 (*) [64])(local_168.m_data + lVar31) = auVar34;
      lVar31 = lVar31 + 8;
    } while (lVar31 < (long)uVar29);
  }
  if ((long)uVar29 < local_68.m_rows) {
    do {
      local_168.m_data[uVar29] = local_68.m_data[uVar29] - local_168.m_data[uVar29];
      uVar29 = uVar29 + 1;
    } while (local_68.m_rows != uVar29);
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond != true) {
    if (local_158.m_rows == local_168.m_rows) {
LAB_007ba984:
      uVar29 = IVar21 + 7;
      if (-1 < IVar21) {
        uVar29 = IVar21;
      }
      uVar29 = uVar29 & 0xfffffffffffffff8;
      if (7 < IVar21) {
        lVar31 = 0;
        do {
          *(undefined1 (*) [64])(local_158.m_data + lVar31) =
               *(undefined1 (*) [64])(pdVar2 + lVar31);
          lVar31 = lVar31 + 8;
        } while (lVar31 < (long)uVar29);
      }
      pdVar30 = local_158.m_data;
      if ((long)uVar29 < IVar21) {
        do {
          local_158.m_data[uVar29] = pdVar2[uVar29];
          uVar29 = uVar29 + 1;
        } while (IVar21 != uVar29);
      }
      goto LAB_007ba9d2;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,
               local_168.m_rows,1);
    if (local_158.m_rows == IVar21) goto LAB_007ba984;
LAB_007bba35:
    pcVar28 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
    ;
LAB_007bbaf8:
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar28);
  }
  if (local_168.m_rows != local_c8.m_rows) {
LAB_007bba4f:
    pcVar28 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
    ;
    goto LAB_007bba64;
  }
  pdVar22 = local_c8.m_data;
  if (local_158.m_rows != local_168.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_158,
               local_168.m_rows,1);
    if (local_158.m_rows != IVar21) {
LAB_007bbab5:
      pcVar28 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
      ;
      goto LAB_007bbaf8;
    }
  }
  uVar29 = IVar21 + 7;
  if (-1 < IVar21) {
    uVar29 = IVar21;
  }
  uVar29 = uVar29 & 0xfffffffffffffff8;
  if (7 < IVar21) {
    lVar31 = 0;
    do {
      auVar34 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar31),
                               *(undefined1 (*) [64])(pdVar22 + lVar31));
      *(undefined1 (*) [64])(local_158.m_data + lVar31) = auVar34;
      lVar31 = lVar31 + 8;
    } while (lVar31 < (long)uVar29);
  }
  pdVar30 = local_158.m_data;
  if ((long)uVar29 < IVar21) {
    do {
      local_158.m_data[uVar29] = pdVar2[uVar29] * pdVar22[uVar29];
      uVar29 = uVar29 + 1;
    } while (IVar21 != uVar29);
  }
LAB_007ba9d2:
  if (local_188.m_rows != IVar21) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_188,IVar21,1);
    if (local_188.m_rows != IVar21) goto LAB_007bba35;
  }
  uVar29 = IVar21 + 7;
  if (-1 < IVar21) {
    uVar29 = IVar21;
  }
  uVar29 = uVar29 & 0xfffffffffffffff8;
  if (7 < IVar21) {
    lVar31 = 0;
    do {
      *(undefined1 (*) [64])(local_188.m_data + lVar31) = *(undefined1 (*) [64])(pdVar30 + lVar31);
      lVar31 = lVar31 + 8;
    } while (lVar31 < (long)uVar29);
  }
  if ((long)uVar29 < IVar21) {
    do {
      local_188.m_data[uVar29] = pdVar30[uVar29];
      uVar29 = uVar29 + 1;
    } while (IVar21 != uVar29);
  }
  auVar34 = ZEXT1664(auVar41);
  (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_138,&local_188);
  (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_118,&local_158);
  if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
    iternum = 0;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_178;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (double)local_88._0_8_ * local_d8;
    auVar41 = vmaxsd_avx(auVar32,auVar41);
    local_48 = 0x7fffffffffffffff;
    uStack_40 = 0x7fffffffffffffff;
    local_50 = auVar41._0_8_;
    do {
      auVar41 = auVar34._0_16_;
      pdVar2 = local_118.m_data;
      uVar29 = local_118.m_rows;
      if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
        if (local_118.m_rows != local_c8.m_rows) goto LAB_007bba4f;
        pdVar22 = local_c8.m_data;
        if (local_128.m_rows != local_118.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128,
                     local_118.m_rows,1);
          if (local_128.m_rows != uVar29) goto LAB_007bbab5;
        }
        uVar27 = uVar29 + 7;
        if (-1 < (long)uVar29) {
          uVar27 = uVar29;
        }
        uVar27 = uVar27 & 0xfffffffffffffff8;
        if (7 < (long)uVar29) {
          lVar31 = 0;
          do {
            auVar34 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar31),
                                     *(undefined1 (*) [64])(pdVar22 + lVar31));
            *(undefined1 (*) [64])(local_128.m_data + lVar31) = auVar34;
            lVar31 = lVar31 + 8;
          } while (lVar31 < (long)uVar27);
        }
        if ((long)uVar27 < (long)uVar29) {
          do {
            local_128.m_data[uVar27] = pdVar2[uVar27] * pdVar22[uVar27];
            uVar27 = uVar27 + 1;
          } while (uVar29 != uVar27);
        }
      }
      else {
        if (local_128.m_rows != local_118.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128,
                     local_118.m_rows,1);
          if (local_128.m_rows != uVar29) goto LAB_007bba35;
        }
        uVar27 = uVar29 + 7;
        if (-1 < (long)uVar29) {
          uVar27 = uVar29;
        }
        uVar27 = uVar27 & 0xfffffffffffffff8;
        if (7 < (long)uVar29) {
          lVar31 = 0;
          do {
            *(undefined1 (*) [64])(local_128.m_data + lVar31) =
                 *(undefined1 (*) [64])(pdVar2 + lVar31);
            lVar31 = lVar31 + 8;
          } while (lVar31 < (long)uVar27);
        }
        if ((long)uVar27 < (long)uVar29) {
          do {
            local_128.m_data[uVar27] = pdVar2[uVar27];
            uVar27 = uVar27 + 1;
          } while (uVar29 != uVar27);
        }
      }
      if (local_188.m_rows != local_138.m_rows) goto LAB_007bb9a9;
      local_f0.m_lhs = (LhsNested)&local_188;
      local_f0.m_rhs = (RhsNested)&local_138;
      if (local_188.m_rows != 0) {
        if (0 < local_188.m_rows) {
          local_a0.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_188.m_data;
          local_a0.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_138.m_data;
          local_178 = Eigen::internal::
                      redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                      ::
                      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                (&local_a0,(scalar_sum_op<double,_double> *)&local_189,&local_f0);
          uVar29 = local_128.m_rows;
          uStack_170 = extraout_XMM0_Qb;
          goto LAB_007bac75;
        }
LAB_007bb9ed:
        pcVar28 = 
        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
        ;
        goto LAB_007bbaa8;
      }
      local_178 = 0.0;
      uStack_170 = 0;
LAB_007bac75:
      if (uVar29 != local_118.m_rows) goto LAB_007bb9a9;
      local_f0.m_lhs = (LhsNested)&local_128;
      local_f0.m_rhs = (RhsNested)&local_118;
      if (uVar29 == 0) {
        auVar33 = ZEXT816(0) << 0x40;
      }
      else {
        if ((long)uVar29 < 1) goto LAB_007bb9ed;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_128.m_data;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_118.m_data;
        auVar34._0_8_ =
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       (&local_a0,(scalar_sum_op<double,_double> *)&local_189,&local_f0);
        auVar34._8_56_ = extraout_var;
        auVar33 = auVar34._0_16_;
      }
      auVar17._8_8_ = 0x7fffffffffffffff;
      auVar17._0_8_ = 0x7fffffffffffffff;
      auVar32 = vandpd_avx512vl(auVar33,auVar17);
      if (1e-29 <= auVar32._0_8_) {
        local_d8 = auVar33._0_8_;
      }
      else {
        local_d8 = 1e-29;
        local_88 = auVar33;
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar25 = GetLog();
          pCVar26 = ChStreamOutAscii::operator<<
                              (&pCVar25->super_ChStreamOutAscii,
                               "Rayleigh alpha denominator breakdown: ");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,local_178);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26," / ");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,(double)local_88._0_8_);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,"=");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,local_178 / (double)local_88._0_8_);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,"  iter=");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,iternum);
          ChStreamOutAscii::operator<<(pCVar26,"\n");
          local_d8 = 1e-29;
        }
      }
      auVar43._8_8_ = uStack_170;
      auVar43._0_8_ = local_178;
      auVar18._8_8_ = 0x7fffffffffffffff;
      auVar18._0_8_ = 0x7fffffffffffffff;
      auVar33 = vandpd_avx512vl(auVar43,auVar18);
      dVar42 = local_d8;
      if (auVar33._0_8_ < 1e-29) {
        auVar43 = ZEXT816(0x3ff0000000000000);
        dVar42 = 1.0;
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar25 = GetLog();
          pCVar26 = ChStreamOutAscii::operator<<
                              (&pCVar25->super_ChStreamOutAscii,
                               "Rayleigh alpha numerator breakdown: ");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,local_178);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26," / ");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,local_d8);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,"=");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,local_178 / local_d8);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,"  iter=");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,iternum);
          ChStreamOutAscii::operator<<(pCVar26,"\n");
          auVar43 = ZEXT816(0x3ff0000000000000);
          dVar42 = 1.0;
        }
      }
      local_178 = auVar43._0_8_ / dVar42;
      uStack_170 = auVar43._8_8_;
      if ((local_178 < 0.0) &&
         ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true)) {
        pCVar25 = GetLog();
        pCVar26 = ChStreamOutAscii::operator<<
                            (&pCVar25->super_ChStreamOutAscii,"Rayleigh alpha < 0: ");
        pCVar26 = ChStreamOutAscii::operator<<(pCVar26,local_178);
        pCVar26 = ChStreamOutAscii::operator<<(pCVar26,"    iter=");
        pCVar26 = ChStreamOutAscii::operator<<(pCVar26,iternum);
        ChStreamOutAscii::operator<<(pCVar26,"\n");
      }
      IVar21 = local_158.m_rows;
      if (local_158.m_rows < 0) {
LAB_007bb9cb:
        pcVar28 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007bb9e0;
      }
      pdVar2 = local_158.m_data;
      if (local_148.m_rows != local_158.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
                   local_158.m_rows,1);
        if (local_148.m_rows != IVar21) {
          pcVar28 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_007bbaf8;
        }
      }
      uVar29 = IVar21 & 0x7ffffffffffffff8;
      if (7 < (ulong)IVar21) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_178;
        auVar34 = vbroadcastsd_avx512f(auVar4);
        uVar27 = 0;
        do {
          auVar35 = vmulpd_avx512f(auVar34,*(undefined1 (*) [64])(pdVar2 + uVar27));
          *(undefined1 (*) [64])(local_148.m_data + uVar27) = auVar35;
          uVar27 = uVar27 + 8;
        } while (uVar27 < uVar29);
      }
      if ((long)uVar29 < IVar21) {
        do {
          local_148.m_data[uVar29] = local_178 * pdVar2[uVar29];
          uVar29 = uVar29 + 1;
        } while (IVar21 != uVar29);
      }
      if (local_108.m_rows != IVar21) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      uVar29 = IVar21 & 0x7ffffffffffffff8;
      if (7 < IVar21) {
        uVar27 = 0;
        do {
          auVar34 = vaddpd_avx512f(*(undefined1 (*) [64])(local_148.m_data + uVar27),
                                   *(undefined1 (*) [64])(local_108.m_data + uVar27));
          *(undefined1 (*) [64])(local_108.m_data + uVar27) = auVar34;
          uVar27 = uVar27 + 8;
        } while (uVar27 < uVar29);
      }
      if ((long)uVar29 < IVar21) {
        do {
          local_108.m_data[uVar29] = local_148.m_data[uVar29] + local_108.m_data[uVar29];
          uVar29 = uVar29 + 1;
        } while (IVar21 != uVar29);
LAB_007bb047:
        local_f0.m_lhs = (LhsNested)&local_148;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_148.m_data;
        local_58 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)&local_a0,(scalar_sum_op<double,_double> *)&local_189,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                               *)&local_f0);
      }
      else {
        local_f0.m_lhs = (LhsNested)&local_148;
        if (IVar21 != 0) goto LAB_007bb047;
        local_58 = 0.0;
      }
      (*sysd->_vptr_ChSystemDescriptor[0x19])(sysd,&local_108);
      (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_168,&local_108);
      if (local_68.m_rows != local_168.m_rows) goto LAB_007bba07;
      uVar29 = local_68.m_rows + 7;
      if (-1 < local_68.m_rows) {
        uVar29 = local_68.m_rows;
      }
      uVar29 = uVar29 & 0xfffffffffffffff8;
      if (7 < local_68.m_rows) {
        lVar31 = 0;
        do {
          auVar34 = vsubpd_avx512f(*(undefined1 (*) [64])(local_68.m_data + lVar31),
                                   *(undefined1 (*) [64])(local_168.m_data + lVar31));
          *(undefined1 (*) [64])(local_168.m_data + lVar31) = auVar34;
          lVar31 = lVar31 + 8;
        } while (lVar31 < (long)uVar29);
      }
      uVar27 = local_68.m_rows;
      if ((long)uVar29 < local_68.m_rows) {
        do {
          local_168.m_data[uVar29] = local_68.m_data[uVar29] - local_168.m_data[uVar29];
          uVar29 = uVar29 + 1;
          uVar27 = local_168.m_rows;
        } while (local_68.m_rows != uVar29);
      }
      piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
      *piVar1 = *piVar1 + 1;
      local_f0.m_lhs = (LhsNested)&local_168;
      if (uVar27 == 0) {
        auVar33 = ZEXT816(0) << 0x40;
      }
      else {
        if ((long)uVar27 < 1) goto LAB_007bba93;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_168.m_data;
        auVar35._0_8_ =
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&local_a0,(scalar_sum_op<double,_double> *)&local_189,
                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&local_f0);
        auVar35._8_56_ = extraout_var_00;
        auVar33 = auVar35._0_16_;
      }
      auVar33 = vsqrtsd_avx(auVar33,auVar33);
      this->r_proj_resid = auVar33._0_8_;
      if (auVar33._0_8_ < local_50) {
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar25 = GetLog();
          pCVar26 = ChStreamOutAscii::operator<<
                              (&pCVar25->super_ChStreamOutAscii,"P(r)-converged! iter=");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,iternum);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26," |P(r)|=");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,this->r_proj_resid);
          ChStreamOutAscii::operator<<(pCVar26,"\n");
        }
        break;
      }
      pdVar2 = local_188.m_data;
      IVar21 = local_188.m_rows;
      if (local_78.m_rows != local_188.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_78,
                   local_188.m_rows,1);
        if (local_78.m_rows != IVar21) goto LAB_007bba35;
      }
      uVar29 = IVar21 + 7;
      if (-1 < IVar21) {
        uVar29 = IVar21;
      }
      uVar29 = uVar29 & 0xfffffffffffffff8;
      if (7 < IVar21) {
        lVar31 = 0;
        do {
          *(undefined1 (*) [64])(local_78.m_data + lVar31) = *(undefined1 (*) [64])(pdVar2 + lVar31)
          ;
          lVar31 = lVar31 + 8;
        } while (lVar31 < (long)uVar29);
      }
      if ((long)uVar29 < IVar21) {
        do {
          local_78.m_data[uVar29] = pdVar2[uVar29];
          uVar29 = uVar29 + 1;
        } while (IVar21 != uVar29);
      }
      pdVar2 = local_168.m_data;
      IVar21 = local_168.m_rows;
      if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond == true) {
        if (local_168.m_rows != local_c8.m_rows) goto LAB_007bba4f;
        pdVar22 = local_c8.m_data;
        if (local_188.m_rows != local_168.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_188,
                     local_168.m_rows,1);
          if (local_188.m_rows != IVar21) goto LAB_007bbab5;
        }
        uVar29 = IVar21 + 7;
        if (-1 < IVar21) {
          uVar29 = IVar21;
        }
        uVar29 = uVar29 & 0xfffffffffffffff8;
        if (7 < IVar21) {
          lVar31 = 0;
          do {
            auVar34 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar31),
                                     *(undefined1 (*) [64])(pdVar22 + lVar31));
            *(undefined1 (*) [64])(local_188.m_data + lVar31) = auVar34;
            lVar31 = lVar31 + 8;
          } while (lVar31 < (long)uVar29);
        }
        if ((long)uVar29 < IVar21) {
          do {
            local_188.m_data[uVar29] = pdVar2[uVar29] * pdVar22[uVar29];
            uVar29 = uVar29 + 1;
          } while (IVar21 != uVar29);
        }
      }
      else {
        if (local_188.m_rows != local_168.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_188,
                     local_168.m_rows,1);
          if (local_188.m_rows != IVar21) goto LAB_007bba35;
        }
        uVar29 = IVar21 + 7;
        if (-1 < IVar21) {
          uVar29 = IVar21;
        }
        uVar29 = uVar29 & 0xfffffffffffffff8;
        if (7 < IVar21) {
          lVar31 = 0;
          do {
            *(undefined1 (*) [64])(local_188.m_data + lVar31) =
                 *(undefined1 (*) [64])(pdVar2 + lVar31);
            lVar31 = lVar31 + 8;
          } while (lVar31 < (long)uVar29);
        }
        if ((long)uVar29 < IVar21) {
          do {
            local_188.m_data[uVar29] = pdVar2[uVar29];
            uVar29 = uVar29 + 1;
          } while (IVar21 != uVar29);
        }
      }
      pdVar2 = local_138.m_data;
      IVar21 = local_138.m_rows;
      if (local_b8.m_rows != local_138.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_b8,
                   local_138.m_rows,1);
        if (local_b8.m_rows != IVar21) goto LAB_007bba35;
      }
      uVar29 = IVar21 + 7;
      if (-1 < IVar21) {
        uVar29 = IVar21;
      }
      uVar29 = uVar29 & 0xfffffffffffffff8;
      if (7 < IVar21) {
        lVar31 = 0;
        do {
          *(undefined1 (*) [64])(local_b8.m_data + lVar31) = *(undefined1 (*) [64])(pdVar2 + lVar31)
          ;
          lVar31 = lVar31 + 8;
        } while (lVar31 < (long)uVar29);
      }
      if ((long)uVar29 < IVar21) {
        do {
          local_b8.m_data[uVar29] = pdVar2[uVar29];
          uVar29 = uVar29 + 1;
        } while (IVar21 != uVar29);
      }
      auVar34 = ZEXT1664(auVar41);
      (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_138,&local_188);
      IVar21 = local_138.m_rows;
      if (local_138.m_rows != local_b8.m_rows) goto LAB_007bba07;
      pdVar2 = local_138.m_data;
      pdVar22 = local_b8.m_data;
      if (local_148.m_rows != local_138.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_148,
                   local_138.m_rows,1);
        if (local_148.m_rows != IVar21) {
          pcVar28 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_007bbaf8;
        }
      }
      uVar29 = IVar21 + 7;
      if (-1 < IVar21) {
        uVar29 = IVar21;
      }
      uVar29 = uVar29 & 0xfffffffffffffff8;
      if (7 < IVar21) {
        lVar31 = 0;
        do {
          auVar35 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar31),
                                   *(undefined1 (*) [64])(pdVar22 + lVar31));
          *(undefined1 (*) [64])(local_148.m_data + lVar31) = auVar35;
          lVar31 = lVar31 + 8;
        } while (lVar31 < (long)uVar29);
      }
      if ((long)uVar29 < IVar21) {
        do {
          local_148.m_data[uVar29] = pdVar2[uVar29] - pdVar22[uVar29];
          uVar29 = uVar29 + 1;
        } while (IVar21 != uVar29);
      }
      if (local_188.m_rows != IVar21) goto LAB_007bb9a9;
      local_f0.m_lhs = (LhsNested)&local_188;
      local_f0.m_rhs = (RhsNested)&local_148;
      if (IVar21 == 0) {
        local_d8 = 0.0;
        uStack_d0 = 0;
      }
      else {
        if (IVar21 < 1) goto LAB_007bb9ed;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_188.m_data;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_148.m_data;
        auVar34 = ZEXT1664(auVar34._0_16_);
        local_d8 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                             (&local_a0,(scalar_sum_op<double,_double> *)&local_189,&local_f0);
        uStack_d0 = extraout_XMM0_Qb_00;
      }
      if (local_78.m_rows != local_b8.m_rows) {
LAB_007bb9a9:
        __assert_fail("size() == other.size()","/usr/include/eigen3/Eigen/src/Core/Dot.h",0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      local_f0.m_lhs = (LhsNested)&local_78;
      local_f0.m_rhs = (RhsNested)&local_b8;
      if (local_78.m_rows == 0) {
        local_88 = ZEXT816(0);
      }
      else {
        if (local_78.m_rows < 1) goto LAB_007bb9ed;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_78.m_data;
        local_a0.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_b8.m_data;
        auVar34 = ZEXT1664(auVar34._0_16_);
        local_88._0_8_ =
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       (&local_a0,(scalar_sum_op<double,_double> *)&local_189,&local_f0);
        local_88._8_8_ = extraout_XMM0_Qb_01;
      }
      auVar20._8_8_ = uStack_40;
      auVar20._0_8_ = local_48;
      auVar19._8_8_ = uStack_d0;
      auVar19._0_8_ = local_d8;
      auVar41 = vandpd_avx(auVar20,auVar19);
      if ((auVar41._0_8_ < 1e-29) || (auVar41 = vandpd_avx(auVar20,local_88), auVar41._0_8_ < 1e-29)
         ) {
        local_178 = 0.0;
        uStack_170 = 0;
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          auVar34 = ZEXT1664(auVar34._0_16_);
          pCVar25 = GetLog();
          pCVar26 = ChStreamOutAscii::operator<<
                              (&pCVar25->super_ChStreamOutAscii,"Ribiere quotient beta restart: ");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,local_d8);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26," / ");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,(double)local_88._0_8_);
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,"  iter=");
          pCVar26 = ChStreamOutAscii::operator<<(pCVar26,iternum);
          ChStreamOutAscii::operator<<(pCVar26,"\n");
        }
      }
      else {
        local_178 = local_d8 / (double)local_88._0_8_;
        uStack_170 = uStack_d0;
      }
      if (local_158.m_rows < 0) goto LAB_007bb9cb;
      if (local_188.m_rows != local_158.m_rows) {
LAB_007bba1e:
        pcVar28 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_007bba64;
      }
      uVar29 = local_158.m_rows & 0x7ffffffffffffff8;
      if (7 < (ulong)local_158.m_rows) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_178;
        auVar35 = vbroadcastsd_avx512f(auVar5);
        uVar27 = 0;
        do {
          auVar36 = vmulpd_avx512f(auVar35,*(undefined1 (*) [64])(local_158.m_data + uVar27));
          auVar36 = vaddpd_avx512f(auVar36,*(undefined1 (*) [64])(local_188.m_data + uVar27));
          *(undefined1 (*) [64])(local_158.m_data + uVar27) = auVar36;
          uVar27 = uVar27 + 8;
        } while (uVar27 < uVar29);
      }
      if ((long)uVar29 < local_158.m_rows) {
        do {
          local_158.m_data[uVar29] = local_178 * local_158.m_data[uVar29] + local_188.m_data[uVar29]
          ;
          uVar29 = uVar29 + 1;
        } while (local_158.m_rows != uVar29);
      }
      if (local_118.m_rows < 0) goto LAB_007bb9cb;
      if (local_138.m_rows != local_118.m_rows) goto LAB_007bba1e;
      uVar29 = local_118.m_rows & 0x7ffffffffffffff8;
      if (7 < (ulong)local_118.m_rows) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_178;
        auVar35 = vbroadcastsd_avx512f(auVar6);
        uVar27 = 0;
        do {
          auVar36 = vmulpd_avx512f(auVar35,*(undefined1 (*) [64])(local_118.m_data + uVar27));
          auVar36 = vaddpd_avx512f(auVar36,*(undefined1 (*) [64])(local_138.m_data + uVar27));
          *(undefined1 (*) [64])(local_118.m_data + uVar27) = auVar36;
          uVar27 = uVar27 + 8;
        } while (uVar27 < uVar29);
      }
      if ((long)uVar29 < local_118.m_rows) {
        do {
          local_118.m_data[uVar29] = local_178 * local_118.m_data[uVar29] + local_138.m_data[uVar29]
          ;
          uVar29 = uVar29 + 1;
        } while (local_118.m_rows != uVar29);
      }
      if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_58;
        auVar41 = vsqrtsd_avx(auVar34._0_16_,auVar7);
        auVar34 = ZEXT1664(auVar34._0_16_);
        ChIterativeSolverVI::AtIterationEnd
                  (&this->super_ChIterativeSolverVI,this->r_proj_resid,auVar41._0_8_,iternum);
      }
      iternum = iternum + 1;
    } while ((int)iternum <
             (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations);
  }
  (*sysd->_vptr_ChSystemDescriptor[0x15])(sysd,&local_108);
  if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
    pCVar25 = GetLog();
    pCVar26 = ChStreamOutAscii::operator<<(&pCVar25->super_ChStreamOutAscii,"residual: ");
    local_f0.m_lhs = (LhsNested)&local_168;
    if (local_168.m_rows == 0) {
      auVar41 = ZEXT816(0) << 0x40;
    }
    else {
      if (local_168.m_rows < 1) {
LAB_007bba93:
        local_f0.m_lhs = (LhsNested)&local_168;
        pcVar28 = 
        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
        ;
LAB_007bbaa8:
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar28);
      }
      local_a0.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_168.m_data;
      auVar36._0_8_ =
           Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)&local_a0,(scalar_sum_op<double,_double> *)&local_189,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)&local_f0);
      auVar36._8_56_ = extraout_var_01;
      auVar41 = auVar36._0_16_;
    }
    auVar41 = vsqrtsd_avx(auVar41,auVar41);
    pCVar26 = ChStreamOutAscii::operator<<(pCVar26,auVar41._0_8_);
    ChStreamOutAscii::operator<<(pCVar26," ---\n");
  }
  local_178 = this->r_proj_resid;
  if (local_c8.m_data != (double *)0x0) {
    free((void *)local_c8.m_data[-1]);
  }
  if (local_148.m_data != (double *)0x0) {
    free((void *)local_148.m_data[-1]);
  }
  if (local_b8.m_data != (double *)0x0) {
    free((void *)local_b8.m_data[-1]);
  }
  if (local_138.m_data != (double *)0x0) {
    free((void *)local_138.m_data[-1]);
  }
  if (local_128.m_data != (double *)0x0) {
    free((void *)local_128.m_data[-1]);
  }
  if (local_118.m_data != (double *)0x0) {
    free((void *)local_118.m_data[-1]);
  }
  if (local_78.m_data != (double *)0x0) {
    free((void *)local_78.m_data[-1]);
  }
  if (local_188.m_data != (double *)0x0) {
    free((void *)local_188.m_data[-1]);
  }
  if (local_168.m_data != (double *)0x0) {
    free((void *)local_168.m_data[-1]);
  }
  if (local_158.m_data != (double *)0x0) {
    free((void *)local_158.m_data[-1]);
  }
  if (local_68.m_data != (double *)0x0) {
    free((void *)local_68.m_data[-1]);
  }
  if (local_108.m_data != (double *)0x0) {
    free((void *)local_108.m_data[-1]);
  }
  return local_178;
}

Assistant:

double ChSolverPMINRES::Solve_SupportingStiffness(ChSystemDescriptor& sysd) {
    m_iterations = 0;

    // Allocate auxiliary vectors;

    int nv = sysd.CountActiveVariables();
    int nc = sysd.CountActiveConstraints();
    int nx = nv + nc;  // total scalar unknowns, in x vector for full KKT system Z*x-d=0

    if (verbose)
        GetLog() << "\n-----Projected MINRES -supporting stiffness-, n.vars nx=" << nx
                 << "  max.iters=" << m_max_iterations << "\n";

    ChVectorDynamic<> mx(nx);
    ChVectorDynamic<> md(nx);
    ChVectorDynamic<> mp(nx);
    ChVectorDynamic<> mr(nx);
    ChVectorDynamic<> mz(nx);
    ChVectorDynamic<> mz_old(nx);
    ChVectorDynamic<> mZp(nx);
    ChVectorDynamic<> mMZp(nx);
    ChVectorDynamic<> mZMr(nx);
    ChVectorDynamic<> mZMr_old(nx);
    ChVectorDynamic<> mtmp(nx);
    ChVectorDynamic<> mDi(nx);

    //
    // --- Compute a diagonal (scaling) preconditioner for the KKT system:
    //

    // Initialize the mDi vector with the diagonal of the Z matrix
    sysd.BuildDiagonalVector(mDi);

    // Pre-invert the values, to avoid wasting time with divisions in the following.
    // From now, mDi contains the inverse of the diagonal of Z.
    // Note, for constraints, the diagonal is 0, so set inverse of D as 1 assuming
    // a constraint preconditioning and assuming the dot product of jacobians is already about 1.
    for (int nel = 0; nel < mDi.size(); nel++) {
        if (fabs(mDi(nel)) > 1e-9)
            mDi(nel) = 1.0 / mDi(nel);
        else
            mDi(nel) = 1.0;
    }

    //
    // --- Vector initialization and book-keeping
    //

    // Initialize the x vector of unknowns x ={q; -l} (if warm starting needed, initialize
    // x with current values of q and l in variables and constraints)
    if (m_warm_start)
        sysd.FromUnknownsToVector(mx);
    else
        mx.setZero();

    // Initialize the d vector filling it with {f, -b}
    sysd.BuildDiVector(md);

    //
    // --- THE P-MINRES ALGORITHM
    //

    double rel_tol = this->rel_tolerance;
    double abs_tol = m_tolerance;
    double rel_tol_d = md.lpNorm<Eigen::Infinity>() * rel_tol;

    // Initial projection of mx   ***TO DO***?
    sysd.UnknownsProject(mx);

    // r = d - Z*x;
    sysd.SystemProduct(mr, mx);  // r = Z*x
    mr = md - mr;                 // r =-Z*x+d

    if (m_use_precond)
        mp = mr.array() * mDi.array();
    else
        mp = mr;

    // z = Mi * r;
    mz = mp;

    // ZMr = Z*M*r = Z*z
    sysd.SystemProduct(mZMr, mz);  // ZMr = Z*z

    // Zp = Z*p
    sysd.SystemProduct(mZp, mp);  // Zp = Z*p

    //
    // THE LOOP
    //

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // MZp = Mi*Zp; % = Mi*Z*p                  %% -- Precond
        if (m_use_precond)
            mMZp = mZp.array() * mDi.array();
        else
            mMZp = mZp;

        // alpha = (z'*(ZMr))/((MZp)'*(Zp));
        double zZMr = mz.dot(mZMr);    // zZMr = z'* ZMr
        double MZpZp = mMZp.dot(mZp);  // MZpZp = ((MZp)'*(Zp))

        // Robustness improver: case of division by zero
        if (fabs(MZpZp) < 10e-30) {
            if (verbose)
                GetLog() << "Rayleigh alpha denominator breakdown: " << zZMr << " / " << MZpZp << "=" << (zZMr / MZpZp)
                         << "  iter=" << iter << "\n";
            MZpZp = 10e-30;
        }

        // Robustness improver: case when r is orthogonal to Z*r (e.g. at first iteration, if f=0, x=0, with
        // constraints)
        if (fabs(zZMr) < 10e-30) {
            if (verbose)
                GetLog() << "Rayleigh alpha numerator breakdown: " << zZMr << " / " << MZpZp << "=" << (zZMr / MZpZp)
                         << "  iter=" << iter << "\n";
            zZMr = 1;
            MZpZp = 1;
        }

        double alpha = zZMr / MZpZp;  // 3)  alpha = (z'*(ZMr))/((MZp)'*(Zp));

        if (alpha < 0)
            if (verbose)
                GetLog() << "Rayleigh alpha < 0: " << alpha << "    iter=" << iter << "\n";

        // x = x + alpha * p;
        mtmp = alpha * mp;
        mx += mtmp;

        double maxdeltaunknowns = mtmp.norm();  //***better infinity norm for speed reasons?

        // x = Proj(x)
        sysd.UnknownsProject(mx);  // x = P(x)

        // r = d - Z*x;
        sysd.SystemProduct(mr, mx);  // r = Z*x
        mr = md - mr;                 // r =-Z*x+d

        m_iterations++;

        // Terminate iteration when the projected r is small, if (norm(r,2) <= max(rel_tol_d,abs_tol))
        r_proj_resid = mr.norm();
        if (r_proj_resid < ChMax(rel_tol_d, abs_tol)) {
            if (verbose)
                GetLog() << "P(r)-converged! iter=" << iter << " |P(r)|=" << r_proj_resid << "\n";
            break;
        }

        // z_old = z;
        mz_old = mz;

        // z = Mi*r;                                 %% -- Precond
        if (m_use_precond)
            mz = mr.array() * mDi.array();
        else
            mz = mr;

        // ZMr_old = ZMr;
        mZMr_old = mZMr;

        // ZMr = Z*z;
        sysd.SystemProduct(mZMr, mz);  // ZMr = Z*z

        // Ribiere quotient (for flexible preconditioning)
        //    beta = z'*(ZMr-ZMr_old)/(z_old'*(ZMr_old));
        mtmp = mZMr - mZMr_old;
        double numerator = mz.dot(mtmp);
        double denominator = mz_old.dot(mZMr_old);
        // Rayleigh quotient (original Minres)
        /// double numerator   = mr.MatrDot(mz,mZMr);			// 1)  r'* Z *r
        /// double denominator = mr.MatrDot(mz_old,mZMr_old);	// 2)  r_old'* Z *r_old
        double beta = numerator / denominator;

        // Robustness improver: restart if beta=0 or too large
        if (fabs(denominator) < 10e-30 || fabs(numerator) < 10e-30) {
            if (verbose)
                GetLog() << "Ribiere quotient beta restart: " << numerator << " / " << denominator << "  iter=" << iter
                         << "\n";
            beta = 0;
        }

        // p = z + beta * p;
        mp = mz + beta * mp;

        // Zp = ZMr + beta*Zp;   // Optimization!! avoid matr x vect!!! (if no 'p' projection has been done)
        mZp = mZMr + beta * mZp;

        // ---------------------------------------------
        // METRICS - convergence, plots, etc

        // For recording into correction/residuals/violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(r_proj_resid, maxdeltaunknowns, iter);
    }

    // After having solved for unknowns x={q;-l}, now copy those values from x vector to
    // the q values in ChVariable items and to l values in ChConstraint items
    sysd.FromVectorToUnknowns(mx);

    if (verbose)
        GetLog() << "residual: " << mr.norm() << " ---\n";

    return r_proj_resid;
}